

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int stb_vorbis_get_samples_float_interleaved
              (stb_vorbis *f,int channels,float *buffer,int num_floats)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  float **outputs;
  float **local_38;
  
  iVar1 = num_floats / channels;
  uVar10 = f->channels;
  if (channels <= f->channels) {
    uVar10 = channels;
  }
  iVar9 = 0;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  while( true ) {
    if (iVar1 - iVar9 == 0 || iVar1 < iVar9) {
      return iVar9;
    }
    iVar3 = f->channel_buffer_start;
    uVar4 = f->channel_buffer_end - iVar3;
    uVar2 = iVar1 - iVar9;
    if ((int)(uVar4 + iVar9) < iVar1) {
      uVar2 = uVar4;
    }
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      for (lVar7 = 0; (ulong)uVar10 * 4 - lVar7 != 0; lVar7 = lVar7 + 4) {
        *(undefined4 *)((long)buffer + lVar7) =
             *(undefined4 *)
              (uVar6 * 4 + *(long *)((long)f->channel_buffers + lVar7 * 2) + (long)iVar3 * 4);
      }
      buffer = (float *)((long)buffer + lVar7);
      for (uVar8 = (ulong)uVar10; (int)uVar8 < channels; uVar8 = (ulong)((int)uVar8 + 1)) {
        *buffer = 0.0;
        buffer = buffer + 1;
      }
    }
    iVar9 = iVar9 + uVar2;
    f->channel_buffer_start = iVar3 + uVar2;
    if (iVar9 == iVar1) break;
    iVar3 = stb_vorbis_get_frame_float(f,(int *)0x0,&local_38);
    if (iVar3 == 0) {
      return iVar9;
    }
  }
  return iVar1;
}

Assistant:

int stb_vorbis_get_samples_float_interleaved(stb_vorbis *f, int channels, float *buffer, int num_floats)
{
   float **outputs;
   int len = num_floats / channels;
   int n=0;
   int z = f->channels;
   if (z > channels) z = channels;
   while (n < len) {
      int i,j;
      int k = f->channel_buffer_end - f->channel_buffer_start;
      if (n+k >= len) k = len - n;
      for (j=0; j < k; ++j) {
         for (i=0; i < z; ++i)
            *buffer++ = f->channel_buffers[i][f->channel_buffer_start+j];
         for (   ; i < channels; ++i)
            *buffer++ = 0;
      }
      n += k;
      f->channel_buffer_start += k;
      if (n == len)
         break;
      if (!stb_vorbis_get_frame_float(f, NULL, &outputs))
         break;
   }
   return n;
}